

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::Builder::Apply(Builder *this,VersionEdit *edit)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
  *this_00;
  reference pvVar5;
  FileMetaData *this_01;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar6;
  FileMetaData *local_b0;
  FileMetaData *f;
  ulong uStack_a0;
  int level_2;
  size_t i_1;
  undefined1 local_90;
  unsigned_long local_88;
  uint64_t number;
  reference ppStack_78;
  int level_1;
  pair<int,_unsigned_long> *deleted_file_set_kvp;
  iterator __end2;
  iterator __begin2;
  DeletedFileSet *__range2;
  string local_48;
  int local_24;
  ulong uStack_20;
  int level;
  size_t i;
  VersionEdit *edit_local;
  Builder *this_local;
  
  uStack_20 = 0;
  i = (size_t)edit;
  edit_local = (VersionEdit *)this;
  while( true ) {
    uVar1 = uStack_20;
    sVar3 = std::
            vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
            ::size((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                    *)(i + 0x48));
    if (sVar3 <= uVar1) break;
    pvVar4 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                           *)(i + 0x48),uStack_20);
    local_24 = pvVar4->first;
    pvVar4 = std::
             vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::InternalKey>,_std::allocator<std::pair<int,_leveldb::InternalKey>_>_>
                           *)(i + 0x48),uStack_20);
    ___range2 = InternalKey::Encode(&pvVar4->second);
    Slice::ToString_abi_cxx11_(&local_48,(Slice *)&__range2);
    std::__cxx11::string::operator=
              ((string *)(&this->vset_->field_0x170 + (long)local_24 * 0x20),(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    uStack_20 = uStack_20 + 1;
  }
  this_00 = (set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
             *)(i + 0x60);
  __end2 = std::
           set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
           ::begin(this_00);
  deleted_file_set_kvp =
       (pair<int,_unsigned_long> *)
       std::
       set<std::pair<int,_unsigned_long>,_std::less<std::pair<int,_unsigned_long>_>,_std::allocator<std::pair<int,_unsigned_long>_>_>
       ::end(this_00);
  while( true ) {
    bVar2 = std::operator!=(&__end2,(_Self *)&deleted_file_set_kvp);
    if (!bVar2) break;
    ppStack_78 = std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator*(&__end2);
    number._4_4_ = ppStack_78->first;
    local_88 = ppStack_78->second;
    pVar6 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
            insert(&this->levels_[number._4_4_].deleted_files,&local_88);
    i_1 = (size_t)pVar6.first._M_node;
    local_90 = pVar6.second;
    std::_Rb_tree_const_iterator<std::pair<int,_unsigned_long>_>::operator++(&__end2);
  }
  uStack_a0 = 0;
  while( true ) {
    uVar1 = uStack_a0;
    sVar3 = std::
            vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
            ::size((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                    *)(i + 0x90));
    if (sVar3 <= uVar1) break;
    pvVar5 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                           *)(i + 0x90),uStack_a0);
    f._4_4_ = pvVar5->first;
    this_01 = (FileMetaData *)operator_new(0x58);
    pvVar5 = std::
             vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
             ::operator[]((vector<std::pair<int,_leveldb::FileMetaData>,_std::allocator<std::pair<int,_leveldb::FileMetaData>_>_>
                           *)(i + 0x90),uStack_a0);
    FileMetaData::FileMetaData(this_01,&pvVar5->second);
    this_01->refs = 1;
    this_01->allowed_seeks = (int)(this_01->file_size >> 0xe);
    if (this_01->allowed_seeks < 100) {
      this_01->allowed_seeks = 100;
    }
    local_b0 = this_01;
    std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::erase
              (&this->levels_[f._4_4_].deleted_files,&this_01->number);
    std::
    set<leveldb::FileMetaData_*,_leveldb::VersionSet::Builder::BySmallestKey,_std::allocator<leveldb::FileMetaData_*>_>
    ::insert(this->levels_[f._4_4_].added_files,&local_b0);
    uStack_a0 = uStack_a0 + 1;
  }
  return;
}

Assistant:

void Apply(VersionEdit* edit) {
    // Update compaction pointers
    for (size_t i = 0; i < edit->compact_pointers_.size(); i++) {
      const int level = edit->compact_pointers_[i].first;
      vset_->compact_pointer_[level] =
          edit->compact_pointers_[i].second.Encode().ToString();
    }

    // Delete files
    for (const auto& deleted_file_set_kvp : edit->deleted_files_) {
      const int level = deleted_file_set_kvp.first;
      const uint64_t number = deleted_file_set_kvp.second;
      levels_[level].deleted_files.insert(number);
    }

    // Add new files
    for (size_t i = 0; i < edit->new_files_.size(); i++) {
      const int level = edit->new_files_[i].first;
      FileMetaData* f = new FileMetaData(edit->new_files_[i].second);
      f->refs = 1;

      // We arrange to automatically compact this file after
      // a certain number of seeks.  Let's assume:
      //   (1) One seek costs 10ms
      //   (2) Writing or reading 1MB costs 10ms (100MB/s)
      //   (3) A compaction of 1MB does 25MB of IO:
      //         1MB read from this level
      //         10-12MB read from next level (boundaries may be misaligned)
      //         10-12MB written to next level
      // This implies that 25 seeks cost the same as the compaction
      // of 1MB of data.  I.e., one seek costs approximately the
      // same as the compaction of 40KB of data.  We are a little
      // conservative and allow approximately one seek for every 16KB
      // of data before triggering a compaction.
      f->allowed_seeks = static_cast<int>((f->file_size / 16384U));
      if (f->allowed_seeks < 100) f->allowed_seeks = 100;

      levels_[level].deleted_files.erase(f->number);
      levels_[level].added_files->insert(f);
    }
  }